

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::UniversalPrinter<std::optional<wasm::Name>_>::Print
               (Optional<wasm::Name> *value,ostream *os)

{
  char *in_RCX;
  Name name;
  char local_1a [2];
  
  local_1a[1] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1a + 1,1);
  if ((value->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
      super__Optional_payload_base<wasm::Name>._M_engaged == false) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"nullopt",7);
  }
  else {
    name.super_IString.str._M_str = in_RCX;
    name.super_IString.str._M_len =
         (size_t)(value->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
                 super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                 _M_str;
    ::wasm::operator<<((wasm *)os,
                       (ostream *)
                       (value->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                       str._M_len,name);
  }
  local_1a[0] = ')';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1a,1);
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }